

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall
boost::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  iterator itr;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> mm;
  iterator itr_1;
  iterator local_180;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> local_150;
  iterator local_f0;
  iterator local_c0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  path *local_70;
  size_type local_68;
  iterator local_60;
  
  begin(&local_180,this);
  sVar1 = (this->m_pathname)._M_string_length;
  begin(&local_f0,base);
  local_88 = 0;
  local_80 = 0;
  local_68 = (base->m_pathname)._M_string_length;
  local_90 = &local_80;
  local_70 = base;
  if ((local_180.m_path_ptr != this) || (local_180.m_pos != sVar1)) {
    do {
      if (((local_f0.m_path_ptr == local_70) && (local_f0.m_pos == local_68)) ||
         (iVar2 = compare(&local_180.m_element,&local_f0.m_element), iVar2 != 0)) break;
      m_path_iterator_increment(&local_180);
      m_path_iterator_increment(&local_f0);
    } while ((local_180.m_path_ptr != this) || (local_180.m_pos != sVar1));
  }
  std::pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator>::
  pair<boost::filesystem::path::iterator_&,_boost::filesystem::path::iterator_&,_true>
            (&local_150,&local_180,&local_f0);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_element.m_pathname._M_dataplus._M_p != &local_f0.m_element.m_pathname.field_2) {
    operator_delete(local_f0.m_element.m_pathname._M_dataplus._M_p,
                    local_f0.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_element.m_pathname._M_dataplus._M_p != &local_180.m_element.m_pathname.field_2)
  {
    operator_delete(local_180.m_element.m_pathname._M_dataplus._M_p,
                    local_180.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  begin(&local_c0,this);
  bVar3 = false;
  if ((local_150.first.m_path_ptr == local_c0.m_path_ptr) &&
     (bVar3 = false, local_150.first.m_pos == local_c0.m_pos)) {
    begin(&local_60,base);
    bVar3 = local_60.m_pos == local_150.second.m_pos &&
            local_150.second.m_path_ptr == local_60.m_path_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.m_element.m_pathname._M_dataplus._M_p != &local_60.m_element.m_pathname.field_2)
    {
      operator_delete(local_60.m_element.m_pathname._M_dataplus._M_p,
                      local_60.m_element.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_element.m_pathname._M_dataplus._M_p != &local_c0.m_element.m_pathname.field_2) {
    operator_delete(local_c0.m_element.m_pathname._M_dataplus._M_p,
                    local_c0.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else if ((((local_150.first.m_path_ptr == this) &&
            (local_150.first.m_pos == (this->m_pathname)._M_string_length)) &&
           (local_150.second.m_path_ptr == base)) &&
          (local_150.second.m_pos == (base->m_pathname)._M_string_length)) {
    detail::dot_path();
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p,
               detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p +
               detail::dot_path::dot_pth.m_pathname._M_string_length);
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    while ((local_150.second.m_path_ptr != base ||
           (local_150.second.m_pos != (base->m_pathname)._M_string_length))) {
      detail::dot_dot_path();
      operator/=(__return_storage_ptr__,&detail::dot_dot_path::dot_dot);
      m_path_iterator_increment(&local_150.second);
    }
    while ((local_150.first.m_path_ptr != this ||
           (local_150.first.m_pos != (this->m_pathname)._M_string_length))) {
      operator/=(__return_storage_ptr__,(path *)&local_150);
      m_path_iterator_increment(&local_150.first);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.second.m_element.m_pathname._M_dataplus._M_p !=
      &local_150.second.m_element.m_pathname.field_2) {
    operator_delete(local_150.second.m_element.m_pathname._M_dataplus._M_p,
                    local_150.second.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first.m_element.m_pathname._M_dataplus._M_p !=
      &local_150.first.m_element.m_pathname.field_2) {
    operator_delete(local_150.first.m_element.m_pathname._M_dataplus._M_p,
                    local_150.first.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_relative(const path& base) const
  {
    std::pair<path::iterator, path::iterator> mm
      = detail::mismatch(begin(), end(), base.begin(), base.end());
    if (mm.first == begin() && mm.second == base.begin())
      return path();
    if (mm.first == end() && mm.second == base.end())
      return detail::dot_path();
    path tmp;
    for (; mm.second != base.end(); ++mm.second)
      tmp /= detail::dot_dot_path();
    for (; mm.first != end(); ++mm.first)
      tmp /= *mm.first;
    return tmp;
  }